

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

void __thiscall
vera::Camera::setExposure(Camera *this,float _aperture,float _shutterSpeed,float _sensitivity)

{
  float __x;
  float fVar1;
  
  this->m_aperture = _aperture;
  this->m_shutterSpeed = _shutterSpeed;
  this->m_sensitivity = _sensitivity;
  __x = (((_aperture * _aperture) / _shutterSpeed) * 100.0) / _sensitivity;
  fVar1 = log2f(__x);
  this->m_ev100 = fVar1;
  this->m_exposure = (double)(1.0 / (__x * 1.2));
  (this->super_Node).bChange = true;
  return;
}

Assistant:

void  Camera::setExposure(float _aperture, float _shutterSpeed, float _sensitivity) {
    m_aperture = _aperture;
    m_shutterSpeed = _shutterSpeed;
    m_sensitivity = _sensitivity;
    
    // With N = aperture, t = shutter speed and S = sensitivity,
    // we can compute EV100 knowing that:
    //
    // EVs = log2(N^2 / t)
    // and
    // EVs = EV100 + log2(S / 100)
    //
    // We can therefore find:
    //
    // EV100 = EVs - log2(S / 100)
    // EV100 = log2(N^2 / t) - log2(S / 100)
    // EV100 = log2((N^2 / t) * (100 / S))
    //
    // Reference: https://en.wikipedia.org/wiki/Exposure_value
    m_ev100 = std::log2((_aperture * _aperture) / _shutterSpeed * 100.0f / _sensitivity);

    // This is equivalent to calling exposure(ev100(N, t, S))
    // By merging the two calls we can remove extra pow()/log2() calls
    const float e = (_aperture * _aperture) / _shutterSpeed * 100.0f / _sensitivity;
    m_exposure = 1.0f / (1.2f * e);

    bChange = true;
}